

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall
GlobOpt::TypeSpecializeFloatBinary
          (GlobOpt *this,Instr *instr,Value *src1Val,Value *src2Val,Value **pDstVal)

{
  OpCode OVar1;
  GlobOpt *dst;
  code *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  OpndKind OVar8;
  uint sourceContextId;
  uint functionId;
  FloatConstantValueInfo *pFVar9;
  Value *pVVar10;
  undefined4 *puVar11;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  char16 *pcVar12;
  uint uVar13;
  char *this_02;
  BailOutKind bailOutKind;
  byte bVar14;
  
  if ((this->field_0xf5 & 0x20) == 0) {
    return false;
  }
  bVar5 = OpCodeAttr::IsInlineBuiltIn(instr->m_opcode);
  OVar1 = instr->m_opcode;
  bailOutKind = BailOutPrimitiveButString;
  if (bVar5) {
    if (OVar1 == InlineArrayPush) {
      bVar5 = ValueInfo::IsFloatConstant(src2Val->valueInfo);
      if (bVar5) {
        pFVar9 = ValueInfo::AsFloatConstant(src2Val->valueInfo);
        bVar5 = (undefined1 *)pFVar9->floatValue == &DAT_fff80002fff80002;
      }
      bVar6 = ValueType::IsLikelyNumber(&src2Val->valueInfo->super_ValueType);
      bVar4 = false;
      if (!bVar6 || bVar5 != false) {
        return false;
      }
      bVar5 = true;
      bVar6 = false;
      bailOutKind = BailOutPrimitiveButString;
      bVar14 = 0;
      bVar3 = bVar5;
    }
    else {
      bVar14 = 1;
      bVar5 = false;
      bVar4 = false;
      bVar3 = false;
      bVar6 = false;
    }
  }
  else {
    bVar14 = 1;
    bVar5 = false;
    uVar13 = (uint)OVar1;
    if (uVar13 < 0x194) {
      if (uVar13 < 0x2d) {
        if (3 < OVar1 - 0x10) {
          if ((1 < OVar1 - 0xc) && (1 < uVar13 - 0x14)) {
            return false;
          }
          goto LAB_004664f1;
        }
switchD_00466434_caseD_2e:
        bVar5 = ValueType::IsNotNumber(&src1Val->valueInfo->super_ValueType);
        if (bVar5) {
          return false;
        }
        bVar7 = ValueType::IsNotNumber(&src2Val->valueInfo->super_ValueType);
        bVar6 = false;
LAB_004665ca:
        bVar5 = false;
        bVar14 = 1;
        bVar3 = false;
        bVar4 = false;
        bailOutKind = BailOutPrimitiveButString;
        if (bVar7 != false) {
          return false;
        }
      }
      else {
        switch(OVar1) {
        case Add_A:
          if (src2Val == (Value *)0x0 || src1Val == (Value *)0x0) {
            return false;
          }
          bVar5 = ValueType::IsLikelyNumber(&src1Val->valueInfo->super_ValueType);
          if (!bVar5) {
            return false;
          }
          bVar7 = ValueType::IsLikelyNumber(&src2Val->valueInfo->super_ValueType);
          bVar5 = false;
          bVar4 = false;
          bVar3 = false;
          bVar6 = false;
          bailOutKind = BailOutPrimitiveButString;
          if (!bVar7) {
            return false;
          }
          break;
        case Div_A:
        case Mul_A:
        case Sub_A:
        case Expo_A:
          goto switchD_00466434_caseD_2e;
        default:
          return false;
        case CmEq_A:
        case CmNeq_A:
        case CmSrEq_A:
        case CmSrNeq_A:
          bVar5 = ValueType::IsNotNumber(&src1Val->valueInfo->super_ValueType);
          if (bVar5) {
            return false;
          }
          bVar5 = ValueType::IsNotNumber(&src2Val->valueInfo->super_ValueType);
          bVar14 = 0;
          if (bVar5) {
            return false;
          }
          bailOutKind = BailOutNumberOnly;
          bVar6 = true;
          bVar5 = false;
          bVar4 = false;
          bVar3 = false;
          break;
        case CmGe_A:
        case CmGt_A:
        case CmLt_A:
        case CmLe_A:
          bVar5 = ValueType::IsNotNumber(&src1Val->valueInfo->super_ValueType);
          if (bVar5) {
            return false;
          }
          bVar7 = ValueType::IsNotNumber(&src2Val->valueInfo->super_ValueType);
          bVar6 = true;
          goto LAB_004665ca;
        }
      }
    }
    else if (OVar1 - 0x194 < 4) {
LAB_004664f1:
      bVar5 = ValueType::IsNotNumber(&src1Val->valueInfo->super_ValueType);
      if (bVar5) {
        return false;
      }
      bVar7 = ValueType::IsNotNumber(&src2Val->valueInfo->super_ValueType);
      bailOutKind = BailOutNumberOnly;
      bVar14 = 0;
      bVar5 = false;
      bVar4 = false;
      bVar3 = false;
      bVar6 = false;
      if (bVar7) {
        return false;
      }
    }
    else {
      if (OVar1 - 0x198 < 4) goto switchD_00466434_caseD_2e;
      bVar4 = true;
      bVar3 = true;
      bVar6 = false;
      if (uVar13 != 0x1ee) {
        return false;
      }
    }
  }
  if (!bVar5) {
    ToTypeSpecUse(this,instr,instr->m_src1,this->currentBlock,src1Val,(IndirOpnd *)0x0,TyFloat64,
                  bailOutKind,false,(Instr *)0x0);
  }
  if (!bVar4) {
    ToTypeSpecUse(this,instr,instr->m_src2,this->currentBlock,src2Val,(IndirOpnd *)0x0,TyFloat64,
                  bVar14 | BailOutNumberOnly,false,(Instr *)0x0);
  }
  if ((!bVar3) && (dst = (GlobOpt *)instr->m_dst, dst != (GlobOpt *)0x0)) {
    if (bVar6) {
      pVVar10 = CreateDstUntransferredValue(this,(ValueType)0x400,instr,src1Val,src2Val);
      *pDstVal = pVVar10;
      this_02 = (char *)dst;
      OVar8 = IR::Opnd::GetKind((Opnd *)dst);
      if (OVar8 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        this_02 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
        ;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar5) {
LAB_00466960:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar11 = 0;
      }
      ToVarStackSym((GlobOpt *)this_02,(StackSym *)dst->intConstantToStackSymMap,this->currentBlock)
      ;
    }
    else {
      pVVar10 = CreateDstUntransferredValue(this,(ValueType)0x108,instr,src1Val,src2Val);
      *pDstVal = pVVar10;
      OVar8 = IR::Opnd::GetKind((Opnd *)dst);
      if (OVar8 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0x2ab7,"(dst->IsRegOpnd())","What else?");
        if (!bVar5) goto LAB_00466960;
        *puVar11 = 0;
      }
      OVar8 = IR::Opnd::GetKind((Opnd *)dst);
      if (OVar8 != OpndKindReg) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
        if (!bVar5) goto LAB_00466960;
        *puVar11 = 0;
      }
      ToFloat64Dst(this,instr,(RegOpnd *)dst,this->currentBlock);
    }
  }
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,GlobOptPhase,sourceContextId,functionId);
  if (bVar5) {
    Output::Print(L"TRACE ");
    if (this->prePassLoop != (Loop *)0x0) {
      Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                    (ulong)(this->prePassLoop->loopNumber - 1));
    }
    Output::Print(L": ");
    Output::Print(L"Type specialized to FLOAT: ");
    IR::Instr::Dump(instr);
    Output::Flush();
  }
  bVar5 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,FloatTypeSpecPhase);
  if (bVar5) {
    Output::Print(L"Type specialized to FLOAT: ");
    pcVar12 = Js::OpCodeUtil::GetOpCodeName(instr->m_opcode);
    Output::Print(L"%s \n",pcVar12);
  }
  return true;
}

Assistant:

bool
GlobOpt::TypeSpecializeFloatBinary(IR::Instr *instr, Value *src1Val, Value *src2Val, Value **pDstVal)
{
    IR::Opnd *src1;
    IR::Opnd *src2;
    IR::Opnd *dst;
    bool allowUndefinedOrNullSrc1 = true;
    bool allowUndefinedOrNullSrc2 = true;

    bool skipSrc1 = false;
    bool skipSrc2 = false;
    bool skipDst = false;
    bool convertDstToBool = false;

    if (!this->DoFloatTypeSpec())
    {
        return false;
    }

    // For inline built-ins we need to do type specialization. Check upfront to avoid duplicating same case labels.
    if (!OpCodeAttr::IsInlineBuiltIn(instr->m_opcode))
    {
        switch (instr->m_opcode)
        {
        case Js::OpCode::Sub_A:
        case Js::OpCode::Mul_A:
        case Js::OpCode::Div_A:
        case Js::OpCode::Expo_A:
            // Avoid if one source is known not to be a number.
            if (src1Val->GetValueInfo()->IsNotNumber() || src2Val->GetValueInfo()->IsNotNumber())
            {
                return false;
            }
            break;

        case Js::OpCode::BrSrEq_A:
        case Js::OpCode::BrSrNeq_A:
        case Js::OpCode::BrEq_A:
        case Js::OpCode::BrNeq_A:
        case Js::OpCode::BrSrNotEq_A:
        case Js::OpCode::BrNotEq_A:
        case Js::OpCode::BrSrNotNeq_A:
        case Js::OpCode::BrNotNeq_A:
            // Avoid if one source is known not to be a number.
            if (src1Val->GetValueInfo()->IsNotNumber() || src2Val->GetValueInfo()->IsNotNumber())
            {
                return false;
            }
            // Undef == Undef, but +Undef != +Undef
            // 0.0 != null, but 0.0 == +null
            //
            // So Bailout on anything but numbers for both src1 and src2
            allowUndefinedOrNullSrc1 = false;
            allowUndefinedOrNullSrc2 = false;
            break;

        case Js::OpCode::BrGt_A:
        case Js::OpCode::BrGe_A:
        case Js::OpCode::BrLt_A:
        case Js::OpCode::BrLe_A:
        case Js::OpCode::BrNotGt_A:
        case Js::OpCode::BrNotGe_A:
        case Js::OpCode::BrNotLt_A:
        case Js::OpCode::BrNotLe_A:
            // Avoid if one source is known not to be a number.
            if (src1Val->GetValueInfo()->IsNotNumber() || src2Val->GetValueInfo()->IsNotNumber())
            {
                return false;
            }
            break;

        case Js::OpCode::Add_A:
            // For Add, we need both sources to be Numbers, otherwise it could be a string concat
            if (!src1Val || !src2Val || !(src1Val->GetValueInfo()->IsLikelyNumber() && src2Val->GetValueInfo()->IsLikelyNumber()))
            {
                return false;
            }
            break;

        case Js::OpCode::ArgOut_A_InlineBuiltIn:
            skipSrc2 = true;
            skipDst = true;
            break;

        case Js::OpCode::CmEq_A:
        case Js::OpCode::CmSrEq_A:
        case Js::OpCode::CmNeq_A:
        case Js::OpCode::CmSrNeq_A:
        {
            if (src1Val->GetValueInfo()->IsNotNumber() || src2Val->GetValueInfo()->IsNotNumber())
            {
                return false;
            }

            allowUndefinedOrNullSrc1 = false;
            allowUndefinedOrNullSrc2 = false;
            convertDstToBool = true;
            break;
        }

        case Js::OpCode::CmLe_A:
        case Js::OpCode::CmLt_A:
        case Js::OpCode::CmGe_A:
        case Js::OpCode::CmGt_A:
        {
            if (src1Val->GetValueInfo()->IsNotNumber() || src2Val->GetValueInfo()->IsNotNumber())
            {
                return false;
            }

            convertDstToBool = true;
            break;
        }
        
        default:
            return false;
        }
    }
    else
    {
        switch (instr->m_opcode)
        {
            case Js::OpCode::InlineArrayPush:
                bool isFloatConstMissingItem = src2Val->GetValueInfo()->IsFloatConstant();

                if(isFloatConstMissingItem)
                {
                    FloatConstType floatValue = src2Val->GetValueInfo()->AsFloatConstant()->FloatValue();
                    isFloatConstMissingItem = Js::SparseArraySegment<double>::IsMissingItem(&floatValue);
                }
                // Don't specialize if the element is not likelyNumber - we will surely bailout
                if(!(src2Val->GetValueInfo()->IsLikelyNumber()) || isFloatConstMissingItem)
                {
                    return false;
                }
                // Only specialize the Second source - element
                skipSrc1 = true;
                skipDst = true;
                allowUndefinedOrNullSrc2 = false;
                break;
        }
    }

    // Make sure the srcs are specialized
    if(!skipSrc1)
    {
        src1 = instr->GetSrc1();
        this->ToFloat64(instr, src1, this->currentBlock, src1Val, nullptr, (allowUndefinedOrNullSrc1 ? IR::BailOutPrimitiveButString : IR::BailOutNumberOnly));
    }

    if (!skipSrc2)
    {
        src2 = instr->GetSrc2();
        this->ToFloat64(instr, src2, this->currentBlock, src2Val, nullptr, (allowUndefinedOrNullSrc2 ? IR::BailOutPrimitiveButString : IR::BailOutNumberOnly));
    }

    if (!skipDst)
    {
        dst = instr->GetDst();
        if (dst)
        {
            if (convertDstToBool)
            {
                *pDstVal = CreateDstUntransferredValue(ValueType::Boolean, instr, src1Val, src2Val);
                ToVarRegOpnd(dst->AsRegOpnd(), currentBlock);
            }
            else
            {
                *pDstVal = CreateDstUntransferredValue(ValueType::Float, instr, src1Val, src2Val);
                AssertMsg(dst->IsRegOpnd(), "What else?");
                this->ToFloat64Dst(instr, dst->AsRegOpnd(), this->currentBlock);
            }
        }
    }

    GOPT_TRACE_INSTR(instr, _u("Type specialized to FLOAT: "));

#if ENABLE_DEBUG_CONFIG_OPTIONS
    if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::FloatTypeSpecPhase))
    {
        Output::Print(_u("Type specialized to FLOAT: "));
        Output::Print(_u("%s \n"), Js::OpCodeUtil::GetOpCodeName(instr->m_opcode));
    }
#endif

    return true;
}